

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::SelectionEvaluator::hull(SelectionEvaluator *this)

{
  long in_RSI;
  SelectionSet *in_RDI;
  RealType RVar1;
  SelectionSet bs;
  SelectionSet *in_stack_ffffffffffffff78;
  SelectionSet *in_stack_ffffffffffffff80;
  SelectionEvaluator *in_stack_ffffffffffffffb8;
  HullFinder *in_stack_ffffffffffffffc8;
  
  createSelectionSets(in_stack_ffffffffffffffb8);
  HullFinder::findHull(in_stack_ffffffffffffffc8);
  SelectionSet::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  SelectionSet::~SelectionSet((SelectionSet *)0x31f9ab);
  RVar1 = HullFinder::getSurfaceArea((HullFinder *)(in_RSI + 0x2f0));
  *(RealType *)(in_RSI + 0x538) = RVar1;
  *(undefined1 *)(in_RSI + 0x532) = 1;
  RVar1 = HullFinder::getVolume((HullFinder *)(in_RSI + 0x2f0));
  *(RealType *)(in_RSI + 0x548) = RVar1;
  *(undefined1 *)(in_RSI + 0x540) = 1;
  SelectionSet::parallelReduce((SelectionSet *)in_stack_ffffffffffffffc8);
  SelectionSet::~SelectionSet((SelectionSet *)0x31fa27);
  return in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::hull() {
    SelectionSet bs = createSelectionSets();

    bs              = hullFinder.findHull();
    surfaceArea_    = hullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = hullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }